

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::TextDiffReporter::TextDiffReporter(TextDiffReporter *this,ostream *stream)

{
  Reporter *pRVar1;
  FirstWorkingReporter *this_00;
  long lVar2;
  initializer_list<std::shared_ptr<ApprovalTests::Reporter>_> __l;
  allocator_type local_db;
  allocator local_da;
  allocator local_d9;
  shared_ptr<ApprovalTests::Reporter> local_d8;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  reporters;
  undefined8 local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  string local_70;
  string local_50;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__TextDiffReporter_001a0040;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>.
  super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl = (Reporter *)0x0;
  this->stream_ = stream;
  ::std::__cxx11::string::string((string *)&local_50,"diff",&local_d9);
  CustomReporter::createForegroundReporter((CustomReporter *)&local_88,&local_50,TEXT,true);
  local_d8.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88
  ;
  local_d8.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = a_Stack_80[0]._M_pi;
  local_88 = (element_type *)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__cxx11::string::string((string *)&local_70,"C:/Windows/System32/fc.exe",&local_da);
  CustomReporter::createForegroundReporter
            ((CustomReporter *)&local_98,&local_70,TEXT_AND_IMAGE,true);
  local_c8 = local_98;
  p_Stack_c0 = _Stack_90._M_pi;
  local_98 = 0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __l._M_len = 2;
  __l._M_array = &local_d8;
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::vector(&reporters,__l,&local_db);
  lVar2 = 0x18;
  do {
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_d8.
                       super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
  ::std::__cxx11::string::~string((string *)&local_50);
  this_00 = (FirstWorkingReporter *)operator_new(0x20);
  FirstWorkingReporter::FirstWorkingReporter(this_00,&reporters);
  pRVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
           .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>.
  super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl = (Reporter *)this_00;
  if (pRVar1 != (Reporter *)0x0) {
    (*pRVar1->_vptr_Reporter[1])();
  }
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::~vector(&reporters);
  return;
}

Assistant:

TextDiffReporter::TextDiffReporter(std::ostream& stream) : stream_(stream)
    {
        std::vector<std::shared_ptr<Reporter>> reporters = {
            CustomReporter::createForegroundReporter("diff", Type::TEXT, true),
            CustomReporter::createForegroundReporter(
                "C:/Windows/System32/fc.exe", Type::TEXT_AND_IMAGE, true)};
        m_reporter = std::unique_ptr<Reporter>(new FirstWorkingReporter(reporters));
    }